

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemFromBtreeZeroOffset(BtCursor *pCur,u32 amt,Mem *pMem)

{
  char *pcVar1;
  int local_28;
  u32 local_24;
  int rc;
  u32 available;
  Mem *pMem_local;
  BtCursor *pBStack_10;
  u32 amt_local;
  BtCursor *pCur_local;
  
  local_24 = 0;
  local_28 = 0;
  _rc = pMem;
  pMem_local._4_4_ = amt;
  pBStack_10 = pCur;
  pcVar1 = (char *)sqlite3BtreePayloadFetch(pCur,&local_24);
  _rc->z = pcVar1;
  if (local_24 < pMem_local._4_4_) {
    local_28 = sqlite3VdbeMemFromBtree(pBStack_10,0,pMem_local._4_4_,_rc);
  }
  else {
    _rc->flags = 0x4010;
    _rc->n = pMem_local._4_4_;
  }
  return local_28;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFromBtreeZeroOffset(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  u32 amt,          /* Number of bytes to return. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  u32 available = 0;  /* Number of bytes available on the local btree page */
  int rc = SQLITE_OK; /* Return code */

  assert( sqlite3BtreeCursorIsValid(pCur) );
  assert( !VdbeMemDynamic(pMem) );

  /* Note: the calls to BtreeKeyFetch() and DataFetch() below assert()
  ** that both the BtShared and database handle mutexes are held. */
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  pMem->z = (char *)sqlite3BtreePayloadFetch(pCur, &available);
  assert( pMem->z!=0 );

  if( amt<=available ){
    pMem->flags = MEM_Blob|MEM_Ephem;
    pMem->n = (int)amt;
  }else{
    rc = sqlite3VdbeMemFromBtree(pCur, 0, amt, pMem);
  }

  return rc;
}